

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetTypeDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::parsing::Token&,slang::syntax::WithFunctionClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,WithFunctionClauseSyntax **args_4,
          Token *args_5)

{
  WithFunctionClauseSyntax *pWVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  NetTypeDeclarationSyntax *this_00;
  
  this_00 = (NetTypeDeclarationSyntax *)allocate(this,0x90,8);
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar9 = args_3->kind;
  uVar10 = args_3->field_0x2;
  NVar11.raw = (args_3->numFlags).raw;
  uVar12 = args_3->rawLen;
  pIVar3 = args_3->info;
  pWVar1 = *args_4;
  TVar13 = args_5->kind;
  uVar14 = args_5->field_0x2;
  NVar15.raw = (args_5->numFlags).raw;
  uVar16 = args_5->rawLen;
  pIVar4 = args_5->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,NetTypeDeclaration,args);
  (this_00->keyword).kind = TVar5;
  (this_00->keyword).field_0x2 = uVar6;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (this_00->keyword).rawLen = uVar8;
  (this_00->keyword).info = pIVar2;
  (this_00->type).ptr = args_2;
  (this_00->name).kind = TVar9;
  (this_00->name).field_0x2 = uVar10;
  (this_00->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->name).rawLen = uVar12;
  (this_00->name).info = pIVar3;
  this_00->withFunction = pWVar1;
  (this_00->semi).kind = TVar13;
  (this_00->semi).field_0x2 = uVar14;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->semi).rawLen = uVar16;
  (this_00->semi).info = pIVar4;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this_00;
  if (pWVar1 != (WithFunctionClauseSyntax *)0x0) {
    (pWVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }